

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool parse_node_id(VrplibParser *p,char *lexeme,int32_t node_id)

{
  _Bool _Var1;
  uint local_28;
  int local_24;
  int32_t value;
  int32_t node_id_local;
  char *lexeme_local;
  VrplibParser *p_local;
  
  local_28 = 0;
  local_24 = node_id;
  _value = lexeme;
  lexeme_local = (char *)p;
  _Var1 = str_to_int32(lexeme,(int32_t *)&local_28);
  if (_Var1) {
    if (local_28 == local_24 + 1U) {
      p_local._7_1_ = true;
    }
    else {
      parse_error((VrplibParser *)lexeme_local,"Expected node id to be `%d`. Got `%d` instead",
                  (ulong)(local_24 + 1),(ulong)local_28);
      p_local._7_1_ = false;
    }
  }
  else {
    parse_error((VrplibParser *)lexeme_local,"Failed to retrieve integer");
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

static bool parse_node_id(VrplibParser *p, char *lexeme, int32_t node_id) {
    int32_t value = 0;
    if (!str_to_int32(lexeme, &value)) {
        parse_error(p, "Failed to retrieve integer");
        return false;
    }

    if (value != node_id + 1) {
        parse_error(p, "Expected node id to be `%d`. Got `%d` instead",
                    node_id + 1, value);
        return false;
    }

    return true;
}